

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

void __thiscall wasm::WATParser::NullCtx::~NullCtx(NullCtx *this)

{
  NullCtx *this_local;
  
  Lexer::~Lexer(&this->in);
  return;
}

Assistant:

NullCtx(const Lexer& in) : in(in) {}